

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall
argo::parser::parser
          (parser *this,reader *r,bool read_all,size_t p_max_token_length,size_t p_max_nesting_depth
          ,bool p_convert_numbers,bool p_fallback_to_double,bool p_convert_strings)

{
  bool in_stack_00000008;
  bool in_stack_00000010;
  
  this->m_reader = r;
  this->m_read_all = read_all;
  this->m_max_token_length = p_max_token_length;
  this->m_max_nesting_depth = p_max_nesting_depth;
  this->m_convert_numbers = p_convert_numbers;
  this->m_fallback_to_double = in_stack_00000008;
  this->m_convert_strings = in_stack_00000010;
  return;
}

Assistant:

parser::parser(
            reader &r,
            bool   read_all,
            size_t p_max_token_length,
            size_t p_max_nesting_depth,
            bool   p_convert_numbers, 
            bool   p_fallback_to_double, 
            bool   p_convert_strings) :
                        m_reader(r),
                        m_read_all(read_all),
                        m_max_token_length(p_max_token_length),
                        m_max_nesting_depth(p_max_nesting_depth),
                        m_convert_numbers(p_convert_numbers),
                        m_fallback_to_double(p_fallback_to_double), 
                        m_convert_strings(p_convert_strings)
{
}